

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::SectionTracking::TestCaseTracker::Guard::~Guard(Guard *this)

{
  TestCaseTracker *pTVar1;
  _Rb_tree_node_base *p_Var2;
  RunState RVar3;
  
  pTVar1 = this->m_tracker;
  p_Var2 = (pTVar1->m_testCase).m_children._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  RVar3 = Completed;
  do {
    if ((_Rb_tree_header *)p_Var2 ==
        &(pTVar1->m_testCase).m_children._M_t._M_impl.super__Rb_tree_header) {
LAB_0014cbbe:
      (pTVar1->m_testCase).m_runState = RVar3;
      return;
    }
    if (p_Var2[3]._M_color != 3) {
      RVar3 = ExecutingChildren;
      goto LAB_0014cbbe;
    }
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  } while( true );
}

Assistant:

~Guard() {
                m_tracker.leaveTestCase();
            }